

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StuntDouble.hpp
# Opt level: O1

RotMat3x3d * __thiscall
OpenMD::StuntDouble::getA(RotMat3x3d *__return_storage_ptr__,StuntDouble *this,int snapshotNo)

{
  uint i;
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  double (*padVar3) [3];
  double (*padVar4) [3];
  long lVar5;
  
  iVar1 = (*this->snapshotMan_->_vptr_SnapshotManager[4])();
  padVar3 = (double (*) [3])
            ((long)this->localIndex_ * 0x48 +
            *(long *)(CONCAT44(extraout_var,iVar1) + 0x48 + this->storage_));
  if ((RotMat3x3d *)padVar3 != __return_storage_ptr__) {
    lVar2 = 0;
    padVar4 = (double (*) [3])__return_storage_ptr__;
    do {
      lVar5 = 0;
      do {
        (((SquareMatrix<double,_3> *)*padVar4)->super_RectMatrix<double,_3U,_3U>).data_[0][lVar5] =
             (((SquareMatrix<double,_3> *)*padVar3)->super_RectMatrix<double,_3U,_3U>).data_[0]
             [lVar5];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 3);
      lVar2 = lVar2 + 1;
      padVar4 = padVar4 + 1;
      padVar3 = padVar3 + 1;
    } while (lVar2 != 3);
  }
  return __return_storage_ptr__;
}

Assistant:

RotMat3x3d getA(int snapshotNo) {
      return ((snapshotMan_->getSnapshot(snapshotNo))->*storage_)
          .aMat[localIndex_];
    }